

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# location_fwd.hpp
# Opt level: O0

void __thiscall toml::detail::location::~location(location *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  
  std::__cxx11::string::~string(in_RDI);
  CLI::std::shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::
  ~shared_ptr((shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
              0x17b0f6);
  return;
}

Assistant:

~location() = default;